

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *printer_00;
  Context *context;
  OneofDescriptor *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  JavaType type;
  char *pcVar6;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar7;
  MessageOptions *this_00;
  Options *pOVar8;
  EnumDescriptor *descriptor;
  Descriptor *pDVar9;
  FieldDescriptor *pFVar10;
  ImmutableFieldGenerator *pIVar11;
  OneofGeneratorInfo *pOVar12;
  FieldOptions *this_01;
  FileDescriptor *descriptor_00;
  int index;
  int __c;
  Descriptor *descriptor_01;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *field_00;
  AlphaNum *a_02;
  string *__s;
  undefined1 in_R8B;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> _Var13;
  string_view java_class_name;
  iterator iVar14;
  string_view sVar15;
  undefined1 auVar16 [16];
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view local_990;
  ImmutableExtensionGenerator local_980;
  int local_93c;
  undefined1 local_938 [4];
  int i_5;
  string_view local_918;
  string_view local_908;
  string local_8f8;
  string_view local_8d8;
  string local_8c8;
  string_view local_8a8;
  string local_898;
  string_view local_878;
  string local_868;
  string_view local_848;
  string_view local_838;
  string_view local_828;
  string_view local_818;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_800;
  string_view local_7f8;
  AlphaNum local_7e8;
  string local_7b8;
  string local_798;
  string_view local_778;
  int local_768;
  int i_4;
  string_view local_758;
  string_view local_748;
  string_view local_738;
  string_view local_728;
  undefined1 local_718 [16];
  string local_708;
  string_view local_6e8;
  string_view local_6d8;
  string local_6c8;
  AlphaNum local_6a8;
  string local_678;
  string_view local_658;
  FieldDescriptor *local_648;
  FieldDescriptor *field_1;
  undefined1 auStack_638 [4];
  int j_1;
  string_view local_628;
  string_view local_618;
  string_view local_608;
  undefined1 local_5f8 [16];
  string local_5e8;
  string_view local_5c8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_5b0;
  string_view local_5a8;
  AlphaNum local_598;
  string local_568;
  string_view local_548;
  string local_538;
  char *local_518;
  string_view local_510;
  FieldDescriptor *local_500;
  FieldDescriptor *field;
  int j;
  string_view local_4e8;
  string_view local_4d8;
  string_view local_4c8;
  string_view local_4b8;
  AlphaNum local_4a8;
  string local_478;
  OneofDescriptor *local_458;
  OneofDescriptor *oneof;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_440;
  undefined1 local_438 [8];
  iterator __end3;
  undefined1 local_418 [8];
  iterator __begin3;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string_view local_3c0;
  uint local_3b0;
  int local_3ac;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageGenerator messageGenerator;
  undefined1 local_340 [4];
  int i_1;
  int local_2e4;
  undefined1 auStack_2e0 [4];
  int i;
  string_view local_2d0;
  string_view local_2c0;
  string_view local_2b0;
  string_view local_2a0;
  string_view local_290;
  string_view local_280;
  string_view local_270;
  string_view local_260;
  string_view local_250;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_238;
  string_view local_230;
  string_view local_220;
  string local_210;
  Arg local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  string local_1b0;
  string_view local_190;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_178;
  string_view local_170;
  string_view local_160;
  undefined1 local_150 [8];
  string builder_type;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [80];
  string local_a8;
  allocator<char> local_81;
  string_view local_80;
  string local_70 [48];
  undefined1 local_40 [8];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  variables.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0xf] =
       IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_40);
  pcVar6 = "static ";
  if ((variables.
       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .settings_.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
       heap_or_soo_.soo_data[0xf] & 1) != 0) {
    pcVar6 = "";
  }
  pbVar7 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_40,(key_arg<char[7]> *)0xac8459);
  std::__cxx11::string::operator=((string *)pbVar7,pcVar6);
  local_80 = Descriptor::name((this->super_MessageGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_70,&local_80,&local_81);
  pbVar7 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_40,(key_arg<char[10]> *)0xa117a7);
  std::__cxx11::string::operator=((string *)pbVar7,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_81);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)(local_f8 + 0x50),(java *)(this->super_MessageGenerator).descriptor_,
             descriptor_01);
  pbVar7 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_40,(key_arg<char[17]> *)"extra_interfaces");
  std::__cxx11::string::operator=((string *)pbVar7,(string *)(local_f8 + 0x50));
  std::__cxx11::string::~string((string *)(local_f8 + 0x50));
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar2 = MessageOptions::deprecated(this_00);
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "@java.lang.Deprecated ";
  }
  pbVar7 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)local_40,(key_arg<char[12]> *)0xb17573);
  std::__cxx11::string::operator=((string *)pbVar7,pcVar6);
  printer_00 = (Printer *)(this->super_MessageGenerator).descriptor_;
  pOVar8 = Context::options(this->context_);
  java::Options::Options((Options *)local_f8,pOVar8);
  WriteMessageDocComment
            ((java *)printer,printer_00,(Descriptor *)local_f8,(Options *)0x0,(bool)in_R8B);
  java::Options::~Options((Options *)local_f8);
  pDVar9 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar9,true,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  pOVar8 = Context::options(this->context_);
  if ((pOVar8->opensource_runtime & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&builder_type.field_2 + 8)
               ,"@com.google.protobuf.Internal.ProtoNonnullApi\n");
    io::Printer::Print<>(printer,stack0xfffffffffffffed0);
  }
  std::__cxx11::string::string((string *)local_150);
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (iVar3 < 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_220,"$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,local_220);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,"classname")
    ;
    pDVar9 = (this->super_MessageGenerator).descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_238);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,local_230,pDVar9,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_238);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_250,
               "    com.google.protobuf.GeneratedMessage implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,local_250);
    std::__cxx11::string::operator=
              ((string *)local_150,"com.google.protobuf.GeneratedMessage.Builder<?>");
    _Var13 = local_238;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160,"$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,local_160);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"classname")
    ;
    pDVar9 = (this->super_MessageGenerator).descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_178);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,local_170,pDVar9,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_178);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_190,
               "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,local_190);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c0,"com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>");
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_210,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_1f0,&local_210);
    sVar15._M_str = (char *)&local_1f0;
    sVar15._M_len = (size_t)local_1c0._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_
              (&local_1b0,(lts_20250127 *)local_1c0._M_len,sVar15,(Arg *)local_178);
    std::__cxx11::string::operator=((string *)local_150,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_210);
    _Var13 = local_178;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_260,"private static final long serialVersionUID = 0L;\n");
  io::Printer::Print<>(printer,local_260);
  io::Printer::Indent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_270,"static {\n");
  io::Printer::Print<>(printer,local_270);
  io::Printer::Indent(printer);
  pOVar8 = Context::options(this->context_);
  bVar2 = pOVar8->opensource_runtime;
  local_280 = Descriptor::name((this->super_MessageGenerator).descriptor_);
  java_class_name._M_str = (char *)_Var13;
  java_class_name._M_len = (size_t)local_280._M_str;
  PrintGencodeVersionValidator
            ((java *)printer,(Printer *)(ulong)(bVar2 & 1),local_280._M_len._0_1_,java_class_name);
  io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,"}\n");
  io::Printer::Print<>(printer,local_290);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2a0,
             "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
            );
  local_2b0 = Descriptor::name((this->super_MessageGenerator).descriptor_);
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[12],std::__cxx11::string>
            (printer,local_2a0,(char (*) [10])0xa117a7,&local_2b0,(char (*) [12])"buildertype",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c0,"private $classname$() {\n");
  local_2d0 = Descriptor::name((this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,local_2c0,(char (*) [10])0xa117a7,&local_2d0);
  io::Printer::Indent(printer);
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_2e0,"}\n\n");
  io::Printer::Print<>(printer,_auStack_2e0);
  GenerateDescriptorMethods(this,printer);
  local_2e4 = 0;
  while( true ) {
    iVar3 = local_2e4;
    iVar4 = Descriptor::enum_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar4 <= iVar3) break;
    descriptor = Descriptor::enum_type((this->super_MessageGenerator).descriptor_,local_2e4);
    EnumNonLiteGenerator::EnumNonLiteGenerator
              ((EnumNonLiteGenerator *)local_340,descriptor,true,this->context_);
    EnumNonLiteGenerator::Generate((EnumNonLiteGenerator *)local_340,printer);
    EnumNonLiteGenerator::~EnumNonLiteGenerator((EnumNonLiteGenerator *)local_340);
    local_2e4 = local_2e4 + 1;
  }
  messageGenerator.field_generators_.field_generators_.
  super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar3 = messageGenerator.field_generators_.field_generators_.
            super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    iVar4 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar4 <= iVar3) break;
    pDVar9 = Descriptor::nested_type
                       ((this->super_MessageGenerator).descriptor_,
                        messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar2 = IsMapEntry(pDVar9);
    if (!bVar2) {
      pDVar9 = Descriptor::nested_type
                         ((this->super_MessageGenerator).descriptor_,
                          messageGenerator.field_generators_.field_generators_.
                          super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      ImmutableMessageGenerator((ImmutableMessageGenerator *)&i_2,pDVar9,this->context_);
      GenerateInterface((ImmutableMessageGenerator *)&i_2,printer);
      Generate((ImmutableMessageGenerator *)&i_2,printer);
      ~ImmutableMessageGenerator((ImmutableMessageGenerator *)&i_2);
    }
    messageGenerator.field_generators_.field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         messageGenerator.field_generators_.field_generators_.
         super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  totalInts = 0;
  i_3 = 0;
  while( true ) {
    iVar3 = i_3;
    iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar4 <= iVar3) break;
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_3);
    pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        (&this->field_generators_,pFVar10);
    iVar3 = (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[5])();
    totalInts = iVar3 + totalInts;
    i_3 = i_3 + 1;
  }
  local_3ac = (totalInts + 0x1f) / 0x20;
  for (local_3b0 = 0; (int)local_3b0 < local_3ac; local_3b0 = local_3b0 + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3c0,"private int $bit_field_name$;\n");
    GetBitFieldName_abi_cxx11_
              ((string *)
               ((long)&vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8),(java *)(ulong)local_3b0,index);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,local_3c0,(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8));
    std::__cxx11::string::~string
              ((string *)
               (vars.
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.soo_data + 8));
  }
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range3);
  __begin3._8_8_ = &(this->super_MessageGenerator).oneofs_;
  iVar14 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
           ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                    *)__begin3._8_8_);
  __end3._8_8_ = iVar14.node_;
  __begin3.node_._0_4_ = iVar14.position_;
  local_418 = (undefined1  [8])__end3._8_8_;
  iVar14 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
           ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                  *)__begin3._8_8_);
  kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar14.node_;
  local_440 = iVar14.position_;
  local_438 = (undefined1  [8])kv;
  __end3.node_._0_4_ = local_440;
  while( true ) {
    bVar2 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)local_418,(iterator *)local_438);
    if (!bVar2) break;
    oneof = (OneofDescriptor *)
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                         *)local_418);
    local_458 = (OneofDescriptor *)(oneof->all_names_).payload_;
    pOVar12 = Context::GetOneofGeneratorInfo(this->context_,local_458);
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[11]> *)0xa82482);
    std::__cxx11::string::operator=((string *)pbVar7,(string *)pOVar12);
    pOVar12 = Context::GetOneofGeneratorInfo(this->context_,local_458);
    __s = &pOVar12->capitalized_name;
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[23]> *)"oneof_capitalized_name");
    std::__cxx11::string::operator=((string *)pbVar7,(string *)__s);
    pcVar6 = OneofDescriptor::index(local_458,(char *)__s,__c);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4a8,(int)pcVar6);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_478,(lts_20250127 *)&local_4a8,a);
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[12]> *)"oneof_index");
    std::__cxx11::string::operator=((string *)pbVar7,(string *)&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[2]> *)0xa24ff9);
    std::__cxx11::string::operator=((string *)pbVar7,"");
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[2]> *)0xb17fa7);
    std::__cxx11::string::operator=((string *)pbVar7,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4b8,
               "private int $oneof_name$Case_ = 0;\n@SuppressWarnings(\"serial\")\nprivate java.lang.Object $oneof_name$_;\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range3,local_4b8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4c8,
               "public enum ${$$oneof_capitalized_name$Case$}$\n    implements com.google.protobuf.Internal.EnumLite,\n        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range3,local_4c8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4d8,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4e8,"}");
    pOVar1 = local_458;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&j);
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,local_4d8,local_4e8,pOVar1,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)_j);
    io::Printer::Indent(printer);
    field._0_4_ = 0;
    while( true ) {
      iVar3 = (int)field;
      uVar5 = OneofDescriptor::field_count(local_458);
      pcVar6 = (char *)(ulong)uVar5;
      if ((int)uVar5 <= iVar3) break;
      local_500 = OneofDescriptor::field(local_458,(int)field);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_510,"$deprecation$$field_name$($field_number$),\n");
      this_01 = FieldDescriptor::options(local_500);
      bVar2 = FieldOptions::deprecated(this_01);
      local_518 = "";
      if (bVar2) {
        local_518 = "@java.lang.Deprecated ";
      }
      sVar15 = FieldDescriptor::name(local_500);
      s._M_len = sVar15._M_str;
      s._M_str = (char *)sVar15._M_len;
      local_548 = sVar15;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_538,(lts_20250127 *)sVar15._M_len,s);
      iVar3 = FieldDescriptor::number(local_500);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_598,iVar3);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_568,(lts_20250127 *)&local_598,a_00);
      io::Printer::
      Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,local_510,(char (*) [12])0xb17573,&local_518,(char (*) [11])0xaa5115,
                 &local_538,(char (*) [13])0xc27e70,&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_538);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_5a8,"field_name");
      pFVar10 = local_500;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
                ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_5b0);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,local_5a8,pFVar10,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_5b0);
      field._0_4_ = (int)field + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5c8,"$cap_oneof_name$_NOT_SET(0);\n");
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[11]> *)0xa82482);
    auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar7);
    s_00._M_len = auVar16._8_8_;
    s_00._M_str = pcVar6;
    local_5f8 = auVar16;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_5e8,auVar16._0_8_,s_00);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,local_5c8,(char (*) [15])"cap_oneof_name",&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_608,
               "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range3,local_608);
    pOVar8 = Context::options(this->context_);
    if ((pOVar8->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_618,
                 "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range3,local_618);
    }
    pOVar8 = Context::options(this->context_);
    if ((pOVar8->opensource_runtime & 1U) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_628,"@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
      io::Printer::Print<>(printer,local_628);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_638,
               "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range3,_auStack_638);
    field_1._4_4_ = 0;
    while( true ) {
      iVar3 = field_1._4_4_;
      uVar5 = OneofDescriptor::field_count(local_458);
      pcVar6 = (char *)(ulong)uVar5;
      if ((int)uVar5 <= iVar3) break;
      local_648 = OneofDescriptor::field(local_458,field_1._4_4_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_658,"    case $field_number$: return $field_name$;\n");
      iVar3 = FieldDescriptor::number(local_648);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_6a8,iVar3);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_678,(lts_20250127 *)&local_6a8,a_01);
      sVar15 = FieldDescriptor::name(local_648);
      s_01._M_len = sVar15._M_str;
      s_01._M_str = (char *)sVar15._M_len;
      local_6d8 = sVar15;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_6c8,(lts_20250127 *)sVar15._M_len,s_01);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,local_658,(char (*) [13])0xc27e70,&local_678,(char (*) [11])0xaa5115,
                 &local_6c8);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::__cxx11::string::~string((string *)&local_678);
      field_1._4_4_ = field_1._4_4_ + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_6e8,
               "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
              );
    pbVar7 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&__range3,(key_arg<char[11]> *)0xa82482);
    auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar7);
    s_02._M_len = auVar16._8_8_;
    s_02._M_str = pcVar6;
    local_718 = auVar16;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_708,auVar16._0_8_,s_02);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,local_6e8,(char (*) [15])"cap_oneof_name",&local_708);
    std::__cxx11::string::~string((string *)&local_708);
    io::Printer::Outdent(printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_728,"};\n\n");
    io::Printer::Print<>(printer,local_728);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_738,
               "public $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range3,local_738);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_748,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_758,"}");
    pOVar1 = local_458;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&i_4);
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,local_748,local_758,pOVar1,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)_i_4);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  *)local_418);
  }
  bVar2 = IsAnyMessage((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    GenerateAnyMethods(this,printer);
  }
  local_768 = 0;
  while( true ) {
    iVar3 = local_768;
    iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar4 <= iVar3) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_778,"public static final int $constant_name$ = $number$;\n");
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_768);
    FieldConstantName_abi_cxx11_(&local_798,(java *)pFVar10,field_00);
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_768);
    iVar3 = FieldDescriptor::number(pFVar10);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_7e8,iVar3);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_7b8,(lts_20250127 *)&local_7e8,a_02);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,local_778,(char (*) [14])0xa8db1a,&local_798,(char (*) [7])0xbe447d,
               &local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_798);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_7f8,"constant_name");
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_768);
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_800);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,local_7f8,pFVar10,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_800);
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_768);
    pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        (&this->field_generators_,pFVar10);
    (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[8])(pIVar11,printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_818,"\n");
    io::Printer::Print<>(printer,local_818);
    local_768 = local_768 + 1;
  }
  bVar2 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    GenerateIsInitialized(this,printer);
    GenerateMessageSerializationMethods(this,printer);
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_828,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n");
  local_838 = Descriptor::full_name((this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,local_828,(char (*) [10])0xb93fb9,&local_838);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_848,"private static final $classname$ DEFAULT_INSTANCE;\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_868,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_848,(char (*) [10])0xa117a7,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_878,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_898,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_878,(char (*) [10])0xa117a7,&local_898);
  std::__cxx11::string::~string((string *)&local_898);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8a8,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_8c8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_8a8,(char (*) [10])0xa117a7,&local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  descriptor_00 = Descriptor::file((this->super_MessageGenerator).descriptor_);
  bVar2 = IsWrappersProtoFile(descriptor_00);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_8d8,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
              );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_8f8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,0);
    type = GetJavaType(pFVar10);
    local_908 = PrimitiveTypeName(type);
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,local_8d8,(char (*) [10])0xa117a7,&local_8f8,(char (*) [11])0xaf9f6d,
               &local_908);
    std::__cxx11::string::~string((string *)&local_8f8);
  }
  GenerateParser(this,printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_918,
             "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)local_938,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_918,(char (*) [10])0xa117a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_938);
  std::__cxx11::string::~string((string *)local_938);
  local_93c = 0;
  while( true ) {
    iVar3 = local_93c;
    iVar4 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_);
    if (iVar4 <= iVar3) break;
    pFVar10 = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_93c);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator(&local_980,pFVar10,this->context_);
    ImmutableExtensionGenerator::Generate(&local_980,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator(&local_980);
    local_93c = local_93c + 1;
  }
  io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_990,"}\n\n");
  io::Printer::Print<>(printer,local_990);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range3);
  std::__cxx11::string::~string((string *)local_150);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_40);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables;
  variables["static"] = is_own_file ? "" : "static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type = "com.google.protobuf.GeneratedMessage.Builder<?>";
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();

  printer->Print("static {\n");
  printer->Indent();
  PrintGencodeVersionValidator(printer, context_->options().opensource_runtime,
                               descriptor_->name());
  printer->Outdent();
  printer->Print("}\n");

  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumNonLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars;
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    vars["{"] = "";
    vars["}"] = "";
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "@SuppressWarnings(\"serial\")\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum ${$$oneof_capitalized_name$Case$}$\n"
        // TODO: Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", absl::AsciiStrToUpper(field->name()), "field_number",
          absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @param value The number of the enum to look for.\n"
          " * @return The enum associated with the given number.\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}